

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# indexer.cpp
# Opt level: O3

void build_dindex_recursive<IsoHPlane>
               (size_t curr_node,size_t n_terminal,size_t ncomb,size_t st,size_t end,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *node_indices,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *node_mappings,
               vector<double,_std::allocator<double>_> *node_distances,
               vector<double,_std::allocator<double>_> *node_depths,size_t curr_depth,
               vector<IsoHPlane,_std::allocator<IsoHPlane>_> *tree)

{
  pointer puVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pdVar4;
  ulong uVar5;
  pointer pIVar6;
  unsigned_long uVar7;
  runtime_error *this;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  size_t local_170;
  size_t local_160;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_150;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_170 = curr_depth;
  local_160 = curr_node;
  while( true ) {
    if (st < end) {
      puVar2 = (node_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      puVar3 = (node_mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
               _M_impl.super__Vector_impl_data._M_start;
      pdVar4 = (node_distances->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      uVar8 = st;
      do {
        puVar1 = puVar2 + uVar8;
        uVar8 = uVar8 + 1;
        uVar9 = puVar3[*puVar1];
        uVar10 = uVar8;
        do {
          uVar5 = puVar3[puVar2[uVar10]];
          if (uVar9 < uVar5) {
            lVar11 = uVar5 + (ncomb - uVar9) +
                     ~(((n_terminal - uVar9) + -1) * (n_terminal - uVar9) >> 1);
          }
          else {
            lVar11 = ((uVar9 + ncomb) - uVar5) +
                     ~(((n_terminal - uVar5) + -1) * (n_terminal - uVar5) >> 1);
          }
          pdVar4[lVar11] = pdVar4[lVar11] + 1.0;
          uVar10 = uVar10 + 1;
        } while (uVar10 <= end);
      } while (uVar8 != end);
    }
    pIVar6 = (tree->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if (pIVar6[local_160].hplane_left == 0) {
      (node_depths->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
      super__Vector_impl_data._M_start
      [(node_mappings->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
       super__Vector_impl_data._M_start[local_160]] =
           ((double)CONCAT44(0x45300000,(int)(local_170 >> 0x20)) - 1.9342813113834067e+25) +
           ((double)CONCAT44(0x43300000,(int)local_170) - 4503599627370496.0);
      return;
    }
    if (end < st) break;
    uVar8 = pIVar6[local_160].hplane_right;
    puVar2 = (node_indices->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
             _M_impl.super__Vector_impl_data._M_start;
    uVar9 = st;
    uVar10 = st;
    do {
      if (puVar2[uVar10] < uVar8) {
        uVar7 = puVar2[uVar9];
        puVar2[uVar9] = puVar2[uVar10];
        puVar2[uVar10] = uVar7;
        uVar9 = uVar9 + 1;
      }
      uVar10 = uVar10 + 1;
    } while (uVar10 <= end);
    if (uVar9 == st) break;
    local_170 = local_170 + 1;
    build_dindex_recursive<IsoHPlane>
              (pIVar6[local_160].hplane_left,n_terminal,ncomb,st,uVar9 - 1,node_indices,
               node_mappings,node_distances,node_depths,local_170,tree);
    local_160 = (tree->super__Vector_base<IsoHPlane,_std::allocator<IsoHPlane>_>)._M_impl.
                super__Vector_impl_data._M_start[local_160].hplane_right;
    st = uVar9;
  }
  this = (runtime_error *)__cxa_allocate_exception(0x10);
  local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_150,"Unexpected error in ","");
  local_f0._M_dataplus._M_p = (pointer)&local_f0.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_f0,
             "/workspace/llm4binary/github/license_c_cmakelists/david-cortes[P]isotree/src/indexer.cpp"
             ,"");
  std::operator+(&local_b0,&local_150,&local_f0);
  local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_110,":","");
  std::operator+(&local_90,&local_b0,&local_110);
  std::__cxx11::to_string(&local_d0,0xc9);
  std::operator+(&local_70,&local_90,&local_d0);
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_130,
             ". Please open an issue in GitHub with this information, indicating the installed version of \'isotree\'.\n"
             ,"");
  std::operator+(&local_50,&local_70,&local_130);
  std::runtime_error::runtime_error(this,(string *)&local_50);
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void build_dindex_recursive
(
    const size_t curr_node,
    const size_t n_terminal, const size_t ncomb,
    const size_t st, const size_t end,
    std::vector<size_t> &restrict node_indices, /* array with all terminal indices in 'tree' */
    const std::vector<size_t> &restrict node_mappings, /* tree_index : terminal_index */
    std::vector<double> &restrict node_distances, /* indexed by terminal_index */
    std::vector<double> &restrict node_depths, /* indexed by terminal_index */
    size_t curr_depth,
    const std::vector<Node> &tree
)
{
    if (end > st)
    {
        size_t i, j;
        for (size_t el1 = st; el1 < end; el1++)
        {
            for (size_t el2 = el1 + 1; el2 <= end; el2++)
            {
                i = node_mappings[node_indices[el1]];
                j = node_mappings[node_indices[el2]];
                node_distances[ix_comb(i, j, n_terminal, ncomb)]++;
            }
        }
    }

    if (!is_terminal_node(tree[curr_node]))
    {
        const size_t delim = get_idx_tree_right(tree[curr_node]);
        size_t frontier = st;
        size_t temp;
        for (size_t ix = st; ix <= end; ix++)
        {
           if (node_indices[ix] < delim)
            {
                temp = node_indices[frontier];
                node_indices[frontier] = node_indices[ix];
                node_indices[ix] = temp;
                frontier++;
            }
        }

        if (unlikely(frontier == st)) unexpected_error();

        curr_depth++;
        build_dindex_recursive<Node>(get_idx_tree_left(tree[curr_node]),
                                     n_terminal, ncomb,
                                     st, frontier-1,
                                     node_indices,
                                     node_mappings,
                                     node_distances,
                                     node_depths,
                                     curr_depth,
                                     tree);
        build_dindex_recursive<Node>(get_idx_tree_right(tree[curr_node]),
                                     n_terminal, ncomb,
                                     frontier, end,
                                     node_indices,
                                     node_mappings,
                                     node_distances,
                                     node_depths,
                                     curr_depth,
                                     tree);
    }

    else
    {
        node_depths[node_mappings[curr_node]] = curr_depth;
    }
}